

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option_group * __thiscall
CLI::App::add_option_group<CLI::Option_group>
          (App *this,string *group_name,string *group_description)

{
  bool bVar1;
  undefined8 uVar2;
  element_type *peVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  string *in_RSI;
  App_p app_ptr;
  element_type *ptr;
  shared_ptr<CLI::Option_group> option_group;
  shared_ptr<CLI::App> *in_stack_ffffffffffffff18;
  shared_ptr<CLI::App> *in_stack_ffffffffffffff20;
  __shared_ptr<CLI::Option_group,_(__gnu_cxx::_Lock_policy)2> *this_00;
  App **in_stack_ffffffffffffff48;
  string *__args;
  string *in_stack_ffffffffffffff88;
  IncorrectConstruction *in_stack_ffffffffffffff90;
  __shared_ptr<CLI::Option_group,_(__gnu_cxx::_Lock_policy)2> local_60;
  undefined1 local_4d;
  App_p *in_stack_ffffffffffffffb8;
  App *in_stack_ffffffffffffffc0;
  
  __args = in_RSI;
  bVar1 = CLI::detail::valid_alias_name_string(in_RSI);
  if (!bVar1) {
    local_4d = 1;
    uVar2 = __cxa_allocate_exception(0x38);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_RDX,(char *)__args,(allocator<char> *)in_RSI);
    IncorrectConstruction::IncorrectConstruction
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    local_4d = 0;
    __cxa_throw(uVar2,&IncorrectConstruction::typeinfo,IncorrectConstruction::~IncorrectConstruction
               );
  }
  this_00 = &local_60;
  ::std::make_shared<CLI::Option_group,std::__cxx11::string,std::__cxx11::string&,CLI::App*>
            (__args,in_RSI,in_stack_ffffffffffffff48);
  peVar3 = std::__shared_ptr<CLI::Option_group,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
  ::std::dynamic_pointer_cast<CLI::App,CLI::Option_group>((shared_ptr<CLI::Option_group> *)this_00);
  std::shared_ptr<CLI::App>::shared_ptr(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  add_subcommand(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::shared_ptr<CLI::App>::~shared_ptr((shared_ptr<CLI::App> *)0x1e320f);
  std::shared_ptr<CLI::App>::~shared_ptr((shared_ptr<CLI::App> *)0x1e3223);
  std::shared_ptr<CLI::Option_group>::~shared_ptr((shared_ptr<CLI::Option_group> *)0x1e3230);
  return peVar3;
}

Assistant:

T *add_option_group(std::string group_name, std::string group_description = "") {
        if(!detail::valid_alias_name_string(group_name)) {
            throw IncorrectConstruction("option group names may not contain newlines or null characters");
        }
        auto option_group = std::make_shared<T>(std::move(group_description), group_name, this);
        auto *ptr = option_group.get();
        // move to App_p for overload resolution on older gcc versions
        App_p app_ptr = std::dynamic_pointer_cast<App>(option_group);
        add_subcommand(std::move(app_ptr));
        return ptr;
    }